

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void Js::DynamicProfileInfo::UpdateSourceDynamicProfileManagers(ScriptContext *scriptContext)

{
  SourceDynamicProfileManager *this;
  code *pcVar1;
  bool bVar2;
  LocalFunctionId functionId;
  undefined4 *puVar3;
  SListNodeBase<Memory::Recycler> **ppSVar4;
  WriteBarrierPtr *this_00;
  DynamicProfileInfo **ppDVar5;
  FunctionBody *this_01;
  SourceContextInfo *pSVar6;
  SourceDynamicProfileManager **ppSVar7;
  SourceDynamicProfileManager *sourceDynamicProfileManager;
  FunctionBody *functionBody;
  DynamicProfileInfo **info;
  Iterator __iter;
  DynamicProfileInfoList *profileInfoList;
  ScriptContext *scriptContext_local;
  SListNodeBase<Memory::Recycler> local_20;
  DynamicProfileInfo ***local_18;
  bool local_9;
  
  __iter.current =
       &ScriptContext::GetProfileInfoList(scriptContext)->super_SListNodeBase<Memory::Recycler>;
  _info = SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::GetIterator
                    ((SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)
                     __iter.current);
  while( true ) {
    local_18 = &info;
    if (__iter.list == (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    ppDVar5 = info;
    SListNodeBase<Memory::Recycler>::Next(&local_20);
    ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__
                        ((WriteBarrierPtr *)&local_20);
    bVar2 = SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::IsHead
                      ((SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)ppDVar5,
                       *ppSVar4);
    if (!bVar2) {
      SListNodeBase<Memory::Recycler>::Next((SListNodeBase<Memory::Recycler> *)&scriptContext_local)
      ;
      Memory::WriteBarrierPtr::operator_cast_to_SListNodeBase__
                ((WriteBarrierPtr *)&scriptContext_local);
    }
    local_9 = !bVar2;
    if (!local_9) break;
    this_00 = (WriteBarrierPtr *)
              SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::Iterator::Data
                        ((Iterator *)&info);
    ppDVar5 = Memory::WriteBarrierPtr::operator_cast_to_DynamicProfileInfo__(this_00);
    this_01 = GetFunctionBody(*ppDVar5);
    pSVar6 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)this_01);
    ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SourceDynamicProfileManager__
                        ((WriteBarrierPtr *)&pSVar6->sourceDynamicProfileManager);
    this = *ppSVar7;
    functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_01);
    SourceDynamicProfileManager::SaveDynamicProfileInfo(this,functionId,*ppDVar5);
  }
  return;
}

Assistant:

void DynamicProfileInfo::UpdateSourceDynamicProfileManagers(ScriptContext * scriptContext)
    {
        // We don't clear old dynamic data here, because if a function is inlined, it will never go through the
        // EnsureDynamicProfileThunk and thus not appear in the list. We would want to keep those data as well.
        // Just save/update the data from function that has execute.

        // That means that the data will never go away, probably not a good policy if this is cached for web page in WININET.

        DynamicProfileInfoList * profileInfoList = scriptContext->GetProfileInfoList();
        FOREACH_SLISTBASE_ENTRY(DynamicProfileInfo * const, info, profileInfoList)
        {
            FunctionBody * functionBody = info->GetFunctionBody();
            SourceDynamicProfileManager * sourceDynamicProfileManager = functionBody->GetSourceContextInfo()->sourceDynamicProfileManager;
            sourceDynamicProfileManager->SaveDynamicProfileInfo(functionBody->GetLocalFunctionId(), info);
        }
        NEXT_SLISTBASE_ENTRY
    }